

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfd_transaction_common.cpp
# Opt level: O0

vector<cfd::Utxo,_std::allocator<cfd::Utxo>_> *
cfd::UtxoUtil::ConvertToUtxo(vector<cfd::UtxoData,_std::allocator<cfd::UtxoData>_> *utxos)

{
  bool bVar1;
  vector<cfd::UtxoData,_std::allocator<cfd::UtxoData>_> *in_RSI;
  vector<cfd::Utxo,_std::allocator<cfd::Utxo>_> *in_RDI;
  UtxoData *utxo_data;
  const_iterator __end1;
  const_iterator __begin1;
  vector<cfd::UtxoData,_std::allocator<cfd::UtxoData>_> *__range1;
  iterator ite;
  vector<cfd::Utxo,_std::allocator<cfd::Utxo>_> *result;
  UtxoData *in_stack_00000c20;
  Utxo *in_stack_00000c28;
  UtxoData *in_stack_00000c30;
  reference in_stack_ffffffffffffff98;
  size_type in_stack_ffffffffffffffb8;
  __normal_iterator<const_cfd::UtxoData_*,_std::vector<cfd::UtxoData,_std::allocator<cfd::UtxoData>_>_>
  in_stack_ffffffffffffffc0;
  __normal_iterator<cfd::Utxo_*,_std::vector<cfd::Utxo,_std::allocator<cfd::Utxo>_>_> local_30 [3];
  undefined1 local_11;
  vector<cfd::UtxoData,_std::allocator<cfd::UtxoData>_> *local_10;
  
  local_11 = 0;
  local_10 = in_RSI;
  std::vector<cfd::Utxo,_std::allocator<cfd::Utxo>_>::vector
            ((vector<cfd::Utxo,_std::allocator<cfd::Utxo>_> *)0x509045);
  std::vector<cfd::UtxoData,_std::allocator<cfd::UtxoData>_>::size(local_10);
  std::vector<cfd::Utxo,_std::allocator<cfd::Utxo>_>::resize
            ((vector<cfd::Utxo,_std::allocator<cfd::Utxo>_> *)in_stack_ffffffffffffffc0._M_current,
             in_stack_ffffffffffffffb8);
  local_30[0]._M_current =
       (Utxo *)std::vector<cfd::Utxo,_std::allocator<cfd::Utxo>_>::begin
                         ((vector<cfd::Utxo,_std::allocator<cfd::Utxo>_> *)in_stack_ffffffffffffff98
                         );
  std::vector<cfd::UtxoData,_std::allocator<cfd::UtxoData>_>::begin
            ((vector<cfd::UtxoData,_std::allocator<cfd::UtxoData>_> *)in_stack_ffffffffffffff98);
  std::vector<cfd::UtxoData,_std::allocator<cfd::UtxoData>_>::end
            ((vector<cfd::UtxoData,_std::allocator<cfd::UtxoData>_> *)in_stack_ffffffffffffff98);
  while (bVar1 = __gnu_cxx::operator!=
                           ((__normal_iterator<const_cfd::UtxoData_*,_std::vector<cfd::UtxoData,_std::allocator<cfd::UtxoData>_>_>
                             *)in_RDI,
                            (__normal_iterator<const_cfd::UtxoData_*,_std::vector<cfd::UtxoData,_std::allocator<cfd::UtxoData>_>_>
                             *)in_stack_ffffffffffffff98), bVar1) {
    in_stack_ffffffffffffff98 =
         __gnu_cxx::
         __normal_iterator<const_cfd::UtxoData_*,_std::vector<cfd::UtxoData,_std::allocator<cfd::UtxoData>_>_>
         ::operator*((__normal_iterator<const_cfd::UtxoData_*,_std::vector<cfd::UtxoData,_std::allocator<cfd::UtxoData>_>_>
                      *)&stack0xffffffffffffffc0);
    __gnu_cxx::__normal_iterator<cfd::Utxo_*,_std::vector<cfd::Utxo,_std::allocator<cfd::Utxo>_>_>::
    operator*(local_30);
    ConvertToUtxo(in_stack_00000c30,in_stack_00000c28,in_stack_00000c20);
    __gnu_cxx::__normal_iterator<cfd::Utxo_*,_std::vector<cfd::Utxo,_std::allocator<cfd::Utxo>_>_>::
    operator++(local_30);
    __gnu_cxx::
    __normal_iterator<const_cfd::UtxoData_*,_std::vector<cfd::UtxoData,_std::allocator<cfd::UtxoData>_>_>
    ::operator++((__normal_iterator<const_cfd::UtxoData_*,_std::vector<cfd::UtxoData,_std::allocator<cfd::UtxoData>_>_>
                  *)&stack0xffffffffffffffc0);
  }
  return in_RDI;
}

Assistant:

std::vector<Utxo> UtxoUtil::ConvertToUtxo(const std::vector<UtxoData>& utxos) {
  std::vector<Utxo> result;
  result.resize(utxos.size());
  std::vector<Utxo>::iterator ite = result.begin();
  for (const auto& utxo_data : utxos) {
    ConvertToUtxo(utxo_data, &(*ite));
    ++ite;
  }
  return result;
}